

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O1

ssize_t __thiscall
capnp::
Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>,_capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>_>
::send(Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>,_capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnproto_test::capnp::test::TestAllTypes>_>
       *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long *plVar1;
  OwnPromiseNode node;
  undefined4 in_register_00000034;
  long lVar2;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_59;
  OwnPromiseNode local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  Disposer *local_30;
  SegmentBuilder *local_28;
  code *local_20;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  (**(code **)**(undefined8 **)(lVar2 + 0x30))(&local_58);
  plVar1 = *(long **)(lVar2 + 0x30);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(lVar2 + 0x30) = 0;
    (**(code **)**(undefined8 **)(lVar2 + 0x28))
              (*(undefined8 **)(lVar2 + 0x28),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  local_20 = kj::_::
             SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h:1087:13)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,capnproto_test::capnp::test::TestAllTypes>,capnproto_test::capnp::test::TestGenerics<capnp::Text,capnproto_test::capnp::test::TestAllTypes>>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_>,kj::_::PromiseDisposer,capnp::Request<capnproto_test::capnp::test::TestImplicitMethodParams::CallParams<capnp::Text,capnproto_test::capnp::test::TestAllTypes>,capnproto_test::capnp::test::TestGenerics<capnp::Text,capnproto_test::capnp::test::TestAllTypes>>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,void*&>
            ((PromiseDisposer *)&local_28,&local_58,&local_59,&local_20);
  node.ptr = local_58.ptr;
  (this->super_Builder)._builder.segment = local_28;
  *(undefined4 *)&(this->super_Builder)._builder.capTable = local_50;
  *(undefined4 *)((long)&(this->super_Builder)._builder.capTable + 4) = uStack_4c;
  *(undefined4 *)&(this->super_Builder)._builder.data = (undefined4)uStack_48;
  *(undefined4 *)((long)&(this->super_Builder)._builder.data + 4) = uStack_48._4_4_;
  *(undefined4 *)&(this->super_Builder)._builder.pointers = (undefined4)local_40;
  *(undefined4 *)((long)&(this->super_Builder)._builder.pointers + 4) = local_40._4_4_;
  (this->super_Builder)._builder.dataSize = (StructDataBitCount)uStack_38;
  *(undefined4 *)&(this->super_Builder)._builder.pointerCount = uStack_38._4_4_;
  (this->hook).disposer = local_30;
  uStack_38 = 0;
  local_40 = 0;
  uStack_48 = 0;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<Results> Request<Params, Results>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([](Response<AnyPointer>&& response) -> Response<Results> {
        return Response<Results>(response.getAs<Results>(), kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  typename Results::Pipeline typedPipeline(
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<Results>(kj::mv(typedPromise), kj::mv(typedPipeline));
}